

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coveragetobin.cpp
# Opt level: O0

void coveragetobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  float local_1024;
  int ret;
  OASIS_FLOAT tiv;
  int coverage_id;
  int lineno;
  char line [4096];
  int local_c;
  int last_coverage_id;
  
  local_c = 0;
  tiv = 0.0;
  fgets((char *)&coverage_id,0x1000,_stdin);
  while( true ) {
    tiv = (OASIS_FLOAT)((int)tiv + 1);
    pcVar2 = fgets((char *)&coverage_id,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = doscan((char *)&coverage_id,&ret,&local_1024);
    if (iVar1 != 2) break;
    if (local_c + 1 != ret) {
      fprintf(_stderr,"FATAL: Expecting coverage id %d but got %d\n",(ulong)(local_c + 1),
              (ulong)(uint)ret);
      exit(-1);
    }
    fwrite(&local_1024,4,1,_stdout);
    local_c = ret;
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)(uint)tiv,&coverage_id);
  return;
}

Assistant:

void doit()
	{

		int last_coverage_id = 0;
		char line[4096];
		int lineno = 0;
		fgets(line, sizeof(line), stdin);
		lineno++;

		while (fgets(line, sizeof(line), stdin) != 0)
		{
			int coverage_id;
			OASIS_FLOAT tiv;
			int ret = doscan(line, coverage_id, tiv);
			if (ret != 2) {
				fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
				return;
			}
			else
			{
				if ((last_coverage_id + 1) != coverage_id) {
					fprintf(stderr, "FATAL: Expecting coverage id %d but got %d\n", (last_coverage_id + 1), coverage_id);
					exit(-1);
				}
				fwrite(&tiv, sizeof(tiv), 1, stdout);
				last_coverage_id = coverage_id;
			}
			lineno++;
		}

	}